

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

int Load_ARB_multitexture(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  
  sf_ptrc_glActiveTextureARB = (_func_void_GLenum *)sf::Context::getFunction("glActiveTextureARB");
  bVar16 = sf_ptrc_glActiveTextureARB == (_func_void_GLenum *)0x0;
  sf_ptrc_glClientActiveTextureARB =
       (_func_void_GLenum *)sf::Context::getFunction("glClientActiveTextureARB");
  uVar1 = bVar16 + 1;
  if (sf_ptrc_glClientActiveTextureARB != (_func_void_GLenum *)0x0) {
    uVar1 = (uint)bVar16;
  }
  sf_ptrc_glMultiTexCoord1dARB =
       (_func_void_GLenum_GLdouble *)sf::Context::getFunction("glMultiTexCoord1dARB");
  bVar17 = sf_ptrc_glMultiTexCoord1dARB == (_func_void_GLenum_GLdouble *)0x0;
  sf_ptrc_glMultiTexCoord1dvARB =
       (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord1dvARB");
  bVar16 = sf_ptrc_glMultiTexCoord1dvARB == (_func_void_GLenum_GLdouble_ptr *)0x0;
  sf_ptrc_glMultiTexCoord1fARB =
       (_func_void_GLenum_GLfloat *)sf::Context::getFunction("glMultiTexCoord1fARB");
  bVar18 = sf_ptrc_glMultiTexCoord1fARB == (_func_void_GLenum_GLfloat *)0x0;
  sf_ptrc_glMultiTexCoord1fvARB =
       (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord1fvARB");
  bVar2 = sf_ptrc_glMultiTexCoord1fvARB == (_func_void_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glMultiTexCoord1iARB =
       (_func_void_GLenum_GLint *)sf::Context::getFunction("glMultiTexCoord1iARB");
  bVar19 = sf_ptrc_glMultiTexCoord1iARB == (_func_void_GLenum_GLint *)0x0;
  sf_ptrc_glMultiTexCoord1ivARB =
       (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord1ivARB");
  bVar3 = sf_ptrc_glMultiTexCoord1ivARB == (_func_void_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glMultiTexCoord1sARB =
       (_func_void_GLenum_GLshort *)sf::Context::getFunction("glMultiTexCoord1sARB");
  bVar20 = sf_ptrc_glMultiTexCoord1sARB == (_func_void_GLenum_GLshort *)0x0;
  sf_ptrc_glMultiTexCoord1svARB =
       (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord1svARB");
  bVar4 = sf_ptrc_glMultiTexCoord1svARB == (_func_void_GLenum_GLshort_ptr *)0x0;
  sf_ptrc_glMultiTexCoord2dARB =
       (_func_void_GLenum_GLdouble_GLdouble *)sf::Context::getFunction("glMultiTexCoord2dARB");
  bVar21 = sf_ptrc_glMultiTexCoord2dARB == (_func_void_GLenum_GLdouble_GLdouble *)0x0;
  sf_ptrc_glMultiTexCoord2dvARB =
       (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord2dvARB");
  bVar5 = sf_ptrc_glMultiTexCoord2dvARB == (_func_void_GLenum_GLdouble_ptr *)0x0;
  sf_ptrc_glMultiTexCoord2fARB =
       (_func_void_GLenum_GLfloat_GLfloat *)sf::Context::getFunction("glMultiTexCoord2fARB");
  bVar22 = sf_ptrc_glMultiTexCoord2fARB == (_func_void_GLenum_GLfloat_GLfloat *)0x0;
  sf_ptrc_glMultiTexCoord2fvARB =
       (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord2fvARB");
  bVar6 = sf_ptrc_glMultiTexCoord2fvARB == (_func_void_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glMultiTexCoord2iARB =
       (_func_void_GLenum_GLint_GLint *)sf::Context::getFunction("glMultiTexCoord2iARB");
  bVar23 = sf_ptrc_glMultiTexCoord2iARB == (_func_void_GLenum_GLint_GLint *)0x0;
  sf_ptrc_glMultiTexCoord2ivARB =
       (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord2ivARB");
  bVar7 = sf_ptrc_glMultiTexCoord2ivARB == (_func_void_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glMultiTexCoord2sARB =
       (_func_void_GLenum_GLshort_GLshort *)sf::Context::getFunction("glMultiTexCoord2sARB");
  bVar24 = sf_ptrc_glMultiTexCoord2sARB == (_func_void_GLenum_GLshort_GLshort *)0x0;
  sf_ptrc_glMultiTexCoord2svARB =
       (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord2svARB");
  bVar8 = sf_ptrc_glMultiTexCoord2svARB == (_func_void_GLenum_GLshort_ptr *)0x0;
  sf_ptrc_glMultiTexCoord3dARB =
       (_func_void_GLenum_GLdouble_GLdouble_GLdouble *)
       sf::Context::getFunction("glMultiTexCoord3dARB");
  bVar25 = sf_ptrc_glMultiTexCoord3dARB == (_func_void_GLenum_GLdouble_GLdouble_GLdouble *)0x0;
  sf_ptrc_glMultiTexCoord3dvARB =
       (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord3dvARB");
  bVar9 = sf_ptrc_glMultiTexCoord3dvARB == (_func_void_GLenum_GLdouble_ptr *)0x0;
  sf_ptrc_glMultiTexCoord3fARB =
       (_func_void_GLenum_GLfloat_GLfloat_GLfloat *)sf::Context::getFunction("glMultiTexCoord3fARB")
  ;
  bVar26 = sf_ptrc_glMultiTexCoord3fARB == (_func_void_GLenum_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glMultiTexCoord3fvARB =
       (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord3fvARB");
  bVar10 = sf_ptrc_glMultiTexCoord3fvARB == (_func_void_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glMultiTexCoord3iARB =
       (_func_void_GLenum_GLint_GLint_GLint *)sf::Context::getFunction("glMultiTexCoord3iARB");
  bVar27 = sf_ptrc_glMultiTexCoord3iARB == (_func_void_GLenum_GLint_GLint_GLint *)0x0;
  sf_ptrc_glMultiTexCoord3ivARB =
       (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord3ivARB");
  bVar11 = sf_ptrc_glMultiTexCoord3ivARB == (_func_void_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glMultiTexCoord3sARB =
       (_func_void_GLenum_GLshort_GLshort_GLshort *)sf::Context::getFunction("glMultiTexCoord3sARB")
  ;
  bVar28 = sf_ptrc_glMultiTexCoord3sARB == (_func_void_GLenum_GLshort_GLshort_GLshort *)0x0;
  sf_ptrc_glMultiTexCoord3svARB =
       (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord3svARB");
  bVar12 = sf_ptrc_glMultiTexCoord3svARB == (_func_void_GLenum_GLshort_ptr *)0x0;
  sf_ptrc_glMultiTexCoord4dARB =
       (_func_void_GLenum_GLdouble_GLdouble_GLdouble_GLdouble *)
       sf::Context::getFunction("glMultiTexCoord4dARB");
  bVar29 = sf_ptrc_glMultiTexCoord4dARB ==
           (_func_void_GLenum_GLdouble_GLdouble_GLdouble_GLdouble *)0x0;
  sf_ptrc_glMultiTexCoord4dvARB =
       (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord4dvARB");
  bVar13 = sf_ptrc_glMultiTexCoord4dvARB == (_func_void_GLenum_GLdouble_ptr *)0x0;
  sf_ptrc_glMultiTexCoord4fARB =
       (_func_void_GLenum_GLfloat_GLfloat_GLfloat_GLfloat *)
       sf::Context::getFunction("glMultiTexCoord4fARB");
  bVar30 = sf_ptrc_glMultiTexCoord4fARB == (_func_void_GLenum_GLfloat_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glMultiTexCoord4fvARB =
       (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord4fvARB");
  bVar14 = sf_ptrc_glMultiTexCoord4fvARB == (_func_void_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glMultiTexCoord4iARB =
       (_func_void_GLenum_GLint_GLint_GLint_GLint *)sf::Context::getFunction("glMultiTexCoord4iARB")
  ;
  bVar31 = sf_ptrc_glMultiTexCoord4iARB == (_func_void_GLenum_GLint_GLint_GLint_GLint *)0x0;
  sf_ptrc_glMultiTexCoord4ivARB =
       (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord4ivARB");
  bVar15 = sf_ptrc_glMultiTexCoord4ivARB == (_func_void_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glMultiTexCoord4sARB =
       (_func_void_GLenum_GLshort_GLshort_GLshort_GLshort *)
       sf::Context::getFunction("glMultiTexCoord4sARB");
  bVar32 = sf_ptrc_glMultiTexCoord4sARB == (_func_void_GLenum_GLshort_GLshort_GLshort_GLshort *)0x0;
  sf_ptrc_glMultiTexCoord4svARB =
       (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord4svARB");
  return (uint)bVar32 +
         (uint)bVar31 +
         (uint)bVar30 +
         (uint)bVar29 +
         (uint)bVar28 +
         (uint)bVar27 +
         (uint)bVar26 +
         (uint)bVar25 +
         (uint)bVar24 +
         (uint)bVar23 +
         (uint)bVar22 +
         (uint)bVar21 +
         (uint)bVar20 +
         (uint)bVar19 + (uint)bVar18 + bVar17 + uVar1 + (uint)bVar16 + (uint)bVar2 + (uint)bVar3 +
         (uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 + (uint)bVar8 + (uint)bVar9 +
         (uint)bVar10 + (uint)bVar11 + (uint)bVar12 + (uint)bVar13 + (uint)bVar14 + (uint)bVar15 +
         (uint)(sf_ptrc_glMultiTexCoord4svARB == (_func_void_GLenum_GLshort_ptr *)0x0);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}